

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateTableCreator
          (KotlinKMPGenerator *this,StructDef *struct_def,CodeWriter *writer,IDLOptions *options)

{
  IdlNamer *this_00;
  FieldDef *pFVar1;
  StructDef *pSVar2;
  IDLOptions *pIVar3;
  CodeWriter *writer_00;
  byte bVar4;
  ostream *poVar5;
  int iVar6;
  pointer ppFVar7;
  char *pcVar8;
  uint uVar9;
  string local_2c8;
  StructDef *local_2a8;
  IDLOptions *local_2a0;
  CodeWriter *local_298;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> fields_vec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  function<void_()> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string name;
  anon_class_32_4_e70a39c9 local_1d8;
  stringstream params;
  ostream local_1a8 [376];
  
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            (&fields_vec,&(struct_def->fields).vec);
  bVar4 = 1;
  iVar6 = 0;
  for (ppFVar7 = fields_vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar7 !=
      fields_vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar7 = ppFVar7 + 1) {
    pFVar1 = *ppFVar7;
    if (pFVar1->deprecated == false) {
      if ((pFVar1->value).type.base_type == BASE_TYPE_STRUCT) {
        uVar9 = ((pFVar1->value).type.struct_def)->fixed ^ 1;
        iVar6 = iVar6 + uVar9;
        bVar4 = bVar4 & (byte)uVar9;
      }
      else {
        iVar6 = iVar6 + 1;
      }
    }
  }
  if ((bVar4 & (iVar6 < 0x7f && iVar6 != 0)) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&params,"create",(allocator<char> *)&local_258);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c8,"",(allocator<char> *)&local_278);
    this_00 = &this->namer_;
    IdlNamer::LegacyJavaMethod2(&name,this_00,(string *)&params,struct_def,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&params);
    std::__cxx11::stringstream::stringstream((stringstream *)&params);
    local_2a8 = struct_def;
    local_2a0 = options;
    local_298 = writer;
    std::operator<<(local_1a8,"builder: FlatBufferBuilder");
    for (ppFVar7 = fields_vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppFVar7 !=
        fields_vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppFVar7 = ppFVar7 + 1) {
      pFVar1 = *ppFVar7;
      if (pFVar1->deprecated == false) {
        poVar5 = std::operator<<(local_1a8,", ");
        (*(this_00->super_Namer)._vptr_Namer[7])(&local_2c8,this_00,pFVar1);
        std::operator<<(poVar5,(string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        pcVar8 = ": ";
        if (0xb < (pFVar1->value).type.base_type - BASE_TYPE_UTYPE) {
          pcVar8 = "Offset: ";
        }
        std::operator<<(local_1a8,pcVar8);
        pcVar8 = "?";
        if (pFVar1->presence != kOptional) {
          pcVar8 = "";
        }
        if (0xb < (pFVar1->value).type.base_type - BASE_TYPE_UTYPE) {
          pcVar8 = "";
        }
        GenType_abi_cxx11_(&local_2c8,this,&(pFVar1->value).type);
        poVar5 = std::operator<<(local_1a8,(string *)&local_2c8);
        std::operator<<(poVar5,pcVar8);
        std::__cxx11::string::~string((string *)&local_2c8);
      }
    }
    std::__cxx11::stringbuf::str();
    pSVar2 = local_2a8;
    (*(this_00->super_Namer)._vptr_Namer[0xf])(&local_218,this_00,local_2a8);
    writer_00 = local_298;
    pIVar3 = local_2a0;
    std::operator+(&local_278,"Offset<",&local_218);
    std::operator+(&local_258,&local_278,'>');
    local_1d8.writer = writer_00;
    local_1d8.struct_def = pSVar2;
    local_1d8.fields_vec = &fields_vec;
    local_1d8.this = this;
    std::function<void()>::
    function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateTableCreator(flatbuffers::StructDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_,void>
              ((function<void()> *)&local_238,&local_1d8);
    GenerateFun(writer_00,&name,&local_2c8,&local_258,&local_238,pIVar3->gen_jvmstatic);
    std::_Function_base::~_Function_base(&local_238.super__Function_base);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&params);
    std::__cxx11::string::~string((string *)&name);
  }
  std::_Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
  ~_Vector_base(&fields_vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               );
  return;
}

Assistant:

void GenerateTableCreator(StructDef &struct_def, CodeWriter &writer,
                            const IDLOptions options) const {
    // Generate a method that creates a table in one go. This is only possible
    // when the table has no struct fields, since those have to be created
    // inline, and there's no way to do so in Java.
    bool has_no_struct_fields = true;
    int num_fields = 0;
    auto fields_vec = struct_def.fields.vec;

    for (auto it = fields_vec.begin(); it != fields_vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (IsStruct(field.value.type)) {
        has_no_struct_fields = false;
      } else {
        num_fields++;
      }
    }
    // JVM specifications restrict default constructor params to be < 255.
    // Longs and doubles take up 2 units, so we set the limit to be < 127.
    if (has_no_struct_fields && num_fields && num_fields < 127) {
      // Generate a table constructor of the form:
      // public static int createName(FlatBufferBuilder builder, args...)

      auto name = namer_.LegacyJavaMethod2("create", struct_def, "");
      std::stringstream params;
      params << "builder: FlatBufferBuilder";
      for (auto it = fields_vec.begin(); it != fields_vec.end(); ++it) {
        auto &field = **it;
        if (field.deprecated) continue;
        params << ", " << namer_.Variable(field);
        if (!IsScalar(field.value.type.base_type)) {
          params << "Offset: ";
        } else {
          params << ": ";
        }
        auto optional = field.IsScalarOptional() ? "?" : "";
        params << GenType(field.value.type) << optional;
      }

      GenerateFun(
          writer, name, params.str(), "Offset<" + namer_.Type(struct_def) + '>',
          [&]() {
            writer.SetValue("vec_size", NumToString(fields_vec.size()));
            writer.SetValue("end_method",
                            namer_.Method("end", struct_def.name));
            writer += "builder.startTable({{vec_size}})";

            auto sortbysize = struct_def.sortbysize;
            auto largest = sortbysize ? sizeof(largest_scalar_t) : 1;
            for (size_t size = largest; size; size /= 2) {
              for (auto it = fields_vec.rbegin(); it != fields_vec.rend();
                   ++it) {
                auto &field = **it;
                auto base_type_size = SizeOf(field.value.type.base_type);
                if (!field.deprecated &&
                    (!sortbysize || size == base_type_size)) {
                  writer.SetValue("field_name", namer_.Field(field));

                  // we wrap on null check for scalar optionals
                  writer += field.IsScalarOptional()
                                ? "{{field_name}}?.run { \\"
                                : "\\";

                  writer += namer_.LegacyKotlinMethod("add", field, "") +
                            "(builder, {{field_name}}\\";
                  if (!IsScalar(field.value.type.base_type)) {
                    writer += "Offset\\";
                  }
                  // we wrap on null check for scalar optionals
                  writer += field.IsScalarOptional() ? ") }" : ")";
                }
              }
            }
            writer += "return {{end_method}}(builder)";
          },
          options.gen_jvmstatic);
    }
  }